

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.c
# Opt level: O1

container_t * shared_container_extract_copy(shared_container_t *sc,uint8_t *typecode)

{
  croaring_refcount_t *pcVar1;
  container_t *pcVar2;
  
  *typecode = sc->typecode;
  LOCK();
  pcVar1 = &sc->counter;
  *pcVar1 = *pcVar1 - 1;
  UNLOCK();
  if (*pcVar1 == 0) {
    pcVar2 = sc->container;
    sc->container = (container_t *)0x0;
    roaring_free(sc);
    return pcVar2;
  }
  pcVar2 = container_clone(sc->container,*typecode);
  return pcVar2;
}

Assistant:

container_t *shared_container_extract_copy(shared_container_t *sc,
                                           uint8_t *typecode) {
    assert(sc->typecode != SHARED_CONTAINER_TYPE);
    *typecode = sc->typecode;
    container_t *answer;
    if (croaring_refcount_dec(&sc->counter)) {
        answer = sc->container;
        sc->container = NULL;  // paranoid
        roaring_free(sc);
    } else {
        answer = container_clone(sc->container, *typecode);
    }
    assert(*typecode != SHARED_CONTAINER_TYPE);
    return answer;
}